

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

void __thiscall
Enhedron::Test::Impl::Impl_Results::HumanResults::fail
          (HumanResults *this,NameStack *context,string *given,NameStack *whenStack,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,string *expressionText,
          vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
          *variableList)

{
  bool bVar1;
  size_t sVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  string *expressionText_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *description_local;
  NameStack *whenStack_local;
  string *given_local;
  NameStack *context_local;
  HumanResults *this_local;
  
  writeWhenStack(this,context,given,whenStack);
  sVar2 = whenDepth(this);
  indent(this,sVar2);
  pbVar3 = Enhedron::Impl::Util::Out<std::basic_ostream<char,_std::char_traits<char>_>_>::operator*
                     (&this->output_);
  ::std::operator<<(pbVar3,"Then : ");
  bVar1 = Util::Impl::Impl_Optional::optional::operator_cast_to_bool((optional *)description);
  if (bVar1) {
    pbVar3 = Enhedron::Impl::Util::Out<std::basic_ostream<char,_std::char_traits<char>_>_>::
             operator*(&this->output_);
    pbVar4 = Util::Impl::Impl_Optional::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(description);
    poVar5 = ::std::operator<<(pbVar3,(string *)pbVar4);
    ::std::operator<<(poVar5,"\n");
    sVar2 = whenDepth(this);
    indent(this,sVar2 + 1);
  }
  pbVar3 = Enhedron::Impl::Util::Out<std::basic_ostream<char,_std::char_traits<char>_>_>::operator*
                     (&this->output_);
  poVar5 = ::std::operator<<(pbVar3,"FAILED! ");
  poVar5 = ::std::operator<<(poVar5,(string *)expressionText);
  ::std::operator<<(poVar5,"\n");
  printVariables(this,variableList);
  return;
}

Assistant:

virtual void fail(const NameStack& context,
                          const string& given,
                          const NameStack& whenStack,
                          optional<string> description,
                          const string &expressionText,
                          const vector <Variable> &variableList) override
        {
            writeWhenStack(context, given, whenStack);
            indent(whenDepth());
            (*output_) << "Then : ";

            if (description) {
                *output_ << *description << "\n";
                indent(whenDepth() + 1);
            }

            *output_ << "FAILED! " << expressionText << "\n";
            printVariables(variableList);
        }